

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

Regexp * __thiscall re2::Regexp::ParseState::FinishRegexp(ParseState *this,Regexp *re)

{
  CharClassBuilder *this_00;
  CharClass *pCVar1;
  CharClassBuilder *ccb;
  Regexp *re_local;
  ParseState *this_local;
  
  if (re == (Regexp *)0x0) {
    this_local = (ParseState *)0x0;
  }
  else {
    re->down_ = (Regexp *)0x0;
    this_local = (ParseState *)re;
    if ((re->op_ == '\x14') && ((re->field_7).field_1.name_ != (string *)0x0)) {
      this_00 = (re->field_7).field_3.ccb_;
      (re->field_7).field_1.name_ = (string *)0x0;
      pCVar1 = CharClassBuilder::GetCharClass(this_00);
      (re->field_7).field_3.cc_ = pCVar1;
      if (this_00 != (CharClassBuilder *)0x0) {
        CharClassBuilder::~CharClassBuilder(this_00);
        operator_delete(this_00);
      }
    }
  }
  return (Regexp *)this_local;
}

Assistant:

Regexp* Regexp::ParseState::FinishRegexp(Regexp* re) {
  if (re == NULL)
    return NULL;
  re->down_ = NULL;

  if (re->op_ == kRegexpCharClass && re->ccb_ != NULL) {
    CharClassBuilder* ccb = re->ccb_;
    re->ccb_ = NULL;
    re->cc_ = ccb->GetCharClass();
    delete ccb;
  }

  return re;
}